

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_thread.c
# Opt level: O0

ObjThread * newObjThread(VM *vm,ObjClosure *objClosure)

{
  uint32_t uVar1;
  Frame *pFVar2;
  Value *pVVar3;
  ObjThread *objThread_00;
  ObjThread *objThread;
  Value *newStack;
  uint32_t stackCapacity;
  Frame *frames;
  ObjClosure *objClosure_local;
  VM *vm_local;
  
  pFVar2 = (Frame *)memManager(vm,(void *)0x0,0,0x60);
  uVar1 = ceilToPowerOf2(objClosure->fn->maxStackSlotUsedNum + 1);
  pVVar3 = (Value *)memManager(vm,(void *)0x0,0,uVar1 << 4);
  objThread_00 = (ObjThread *)memManager(vm,(void *)0x0,0,0x60);
  initObjHeader(vm,(ObjHeader *)objThread_00,OT_THREAD,vm->threadClass);
  objThread_00->frames = pFVar2;
  objThread_00->frameCapacity = 4;
  objThread_00->stack = pVVar3;
  objThread_00->stackCapacity = uVar1;
  resetThread(objThread_00,objClosure);
  return objThread_00;
}

Assistant:

ObjThread *newObjThread(VM *vm, ObjClosure *objClosure) {
    ASSERT(objClosure != NULL, "objClosure is NULL!");

    Frame *frames = ALLOCATE_ARRAY(vm, Frame, INITIAL_FRAME_NUM);
    // +1是为了存储接收者, class或者对象
    uint32_t stackCapacity = ceilToPowerOf2(objClosure->fn->maxStackSlotUsedNum + 1);
    Value *newStack = ALLOCATE_ARRAY(vm, Value, stackCapacity);

    ObjThread *objThread = ALLOCATE(vm, ObjThread);
    initObjHeader(vm, &objThread->objHeader, OT_THREAD, vm->threadClass);

    objThread->frames = frames;
    objThread->frameCapacity = INITIAL_FRAME_NUM;
    objThread->stack = newStack;
    objThread->stackCapacity = stackCapacity;

    resetThread(objThread, objClosure);
    return objThread;
}